

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O0

void __thiscall wasm::Vacuum::visitFunction(Vacuum *this,Function *curr)

{
  Expression *curr_00;
  bool bVar1;
  PassOptions *passOptions;
  Module *module;
  byte local_1d9;
  EffectAnalyzer local_1b0;
  BasicType local_3c;
  Type local_38;
  BasicType local_2c;
  Type local_28;
  Expression *local_20;
  Expression *optimized;
  Function *curr_local;
  Vacuum *this_local;
  
  curr_00 = curr->body;
  optimized = (Expression *)curr;
  curr_local = (Function *)this;
  local_28 = Function::getResults(curr);
  local_2c = none;
  bVar1 = wasm::Type::operator!=(&local_28,&local_2c);
  local_20 = optimize(this,curr_00,bVar1,true);
  if (local_20 == (Expression *)0x0) {
    ExpressionManipulator::nop<wasm::Expression>(*(Expression **)(optimized + 6));
  }
  else {
    *(Expression **)(optimized + 6) = local_20;
  }
  local_38 = Function::getResults((Function *)optimized);
  local_3c = none;
  bVar1 = wasm::Type::operator==(&local_38,&local_3c);
  local_1d9 = 0;
  if (bVar1) {
    passOptions = Pass::getPassOptions((Pass *)this);
    module = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                       ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                        &(this->
                         super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                         ).
                         super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                       );
    EffectAnalyzer::EffectAnalyzer(&local_1b0,passOptions,module,(Function *)optimized);
    bVar1 = EffectAnalyzer::hasUnremovableSideEffects(&local_1b0);
    local_1d9 = bVar1 ^ 0xff;
    EffectAnalyzer::~EffectAnalyzer(&local_1b0);
  }
  if ((local_1d9 & 1) != 0) {
    ExpressionManipulator::nop<wasm::Expression>(*(Expression **)(optimized + 6));
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    auto* optimized =
      optimize(curr->body, curr->getResults() != Type::none, true);
    if (optimized) {
      curr->body = optimized;
    } else {
      ExpressionManipulator::nop(curr->body);
    }
    if (curr->getResults() == Type::none &&
        !EffectAnalyzer(getPassOptions(), *getModule(), curr)
           .hasUnremovableSideEffects()) {
      ExpressionManipulator::nop(curr->body);
    }
  }